

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<kj::String> * __thiscall
kj::_::ExceptionOr<kj::String>::operator=
          (ExceptionOr<kj::String> *this,ExceptionOr<kj::String> *param_1)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      pcVar1 = (this->value).ptr.field_1.value.content.ptr;
      if (pcVar1 != (char *)0x0) {
        sVar2 = (this->value).ptr.field_1.value.content.size_;
        (this->value).ptr.field_1.value.content.ptr = (char *)0x0;
        (this->value).ptr.field_1.value.content.size_ = 0;
        pAVar3 = (this->value).ptr.field_1.value.content.disposer;
        (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      (this->value).ptr.field_1.value.content.ptr = (param_1->value).ptr.field_1.value.content.ptr;
      (this->value).ptr.field_1.value.content.size_ =
           (param_1->value).ptr.field_1.value.content.size_;
      (this->value).ptr.field_1.value.content.disposer =
           (param_1->value).ptr.field_1.value.content.disposer;
      (param_1->value).ptr.field_1.value.content.ptr = (char *)0x0;
      (param_1->value).ptr.field_1.value.content.size_ = 0;
      (this->value).ptr.isSet = true;
    }
  }
  if ((param_1->value).ptr.isSet == true) {
    (param_1->value).ptr.isSet = false;
    pcVar1 = (param_1->value).ptr.field_1.value.content.ptr;
    if (pcVar1 != (char *)0x0) {
      sVar2 = (param_1->value).ptr.field_1.value.content.size_;
      (param_1->value).ptr.field_1.value.content.ptr = (char *)0x0;
      (param_1->value).ptr.field_1.value.content.size_ = 0;
      pAVar3 = (param_1->value).ptr.field_1.value.content.disposer;
      (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;